

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::InitializeIntlForDatePrototype(JavascriptLibrary *this)

{
  anon_class_1_0_00000001 datePrototypeInitializer;
  JavascriptLibrary *this_local;
  
  InitializeIntlForPrototypes<Js::JavascriptLibrary::InitializeIntlForDatePrototype()::__0>(this);
  return;
}

Assistant:

void JavascriptLibrary::InitializeIntlForDatePrototype()
    {
        auto datePrototypeInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::DatePrototype);
        };
        InitializeIntlForPrototypes(datePrototypeInitializer);
    }